

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecifySymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::PulseStyleSymbol::checkPreviouslyUsed
          (PulseStyleSymbol *this,TimingPathMap *timingPathMap)

{
  pointer ppEVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  Scope *this_00;
  SyntaxNode *pSVar4;
  Expression *this_01;
  value_type_pointer ppVar5;
  ulong uVar6;
  Expression *this_02;
  uint uVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  pointer ppEVar10;
  Symbol *pSVar11;
  ulong uVar12;
  long lVar13;
  Symbol *pSVar14;
  Diagnostic *this_03;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  SourceLocation SVar19;
  SourceLocation SVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  byte bVar24;
  undefined1 auVar25 [16];
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar26;
  iterator iVar27;
  string_view arg;
  SourceRange range;
  
  this_00 = (this->super_Symbol).parentScope;
  pSVar4 = (this->super_Symbol).originatingSyntax;
  sVar26 = getTerminals(this);
  ppEVar10 = sVar26._M_ptr;
  ppEVar1 = ppEVar10 + sVar26._M_extent._M_extent_value._M_extent_value;
LAB_0033597b:
  if (ppEVar10 == ppEVar1) {
    return;
  }
  this_01 = *ppEVar10;
  pSVar11 = Expression::getSymbolReference(this_01,true);
  if (pSVar11 != (Symbol *)0x0) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = pSVar11;
    uVar15 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar12 = uVar15 >> ((byte)(timingPathMap->table_).
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar15 & 0xff];
    ppVar5 = (timingPathMap->table_).
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
             .arrays.elements_;
    uVar6 = (timingPathMap->table_).
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
            .arrays.groups_size_mask;
    uVar16 = 0;
    do {
      pgVar2 = (timingPathMap->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_boost::unordered::unordered_flat_map<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>,_slang::hash<const_slang::ast::Symbol_*>_>_>_>_>
               .arrays.groups_ + uVar12;
      bVar9 = pgVar2->m[0xf].n;
      uVar21 = (uchar)uVar3;
      auVar25[0] = -(pgVar2->m[0].n == uVar21);
      uVar22 = (uchar)((uint)uVar3 >> 8);
      auVar25[1] = -(pgVar2->m[1].n == uVar22);
      uVar23 = (uchar)((uint)uVar3 >> 0x10);
      auVar25[2] = -(pgVar2->m[2].n == uVar23);
      bVar24 = (byte)((uint)uVar3 >> 0x18);
      auVar25[3] = -(pgVar2->m[3].n == bVar24);
      auVar25[4] = -(pgVar2->m[4].n == uVar21);
      auVar25[5] = -(pgVar2->m[5].n == uVar22);
      auVar25[6] = -(pgVar2->m[6].n == uVar23);
      auVar25[7] = -(pgVar2->m[7].n == bVar24);
      auVar25[8] = -(pgVar2->m[8].n == uVar21);
      auVar25[9] = -(pgVar2->m[9].n == uVar22);
      auVar25[10] = -(pgVar2->m[10].n == uVar23);
      auVar25[0xb] = -(pgVar2->m[0xb].n == bVar24);
      auVar25[0xc] = -(pgVar2->m[0xc].n == uVar21);
      auVar25[0xd] = -(pgVar2->m[0xd].n == uVar22);
      auVar25[0xe] = -(pgVar2->m[0xe].n == uVar23);
      auVar25[0xf] = -(bVar9 == bVar24);
      for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                                  (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe); uVar17 != 0;
          uVar17 = uVar17 - 1 & uVar17) {
        uVar7 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar18 = (ulong)uVar7;
        if (pSVar11 == ppVar5[uVar12 * 0xf + uVar18].first) {
          if (ppVar5[uVar12 * 0xf + uVar18].second.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*>_>_>_>
              .size_ctrl.size == 0) goto LAB_00335b35;
          iVar27 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>
                   ::begin(&ppVar5[uVar12 * 0xf + uVar18].second.table_);
          if (((iVar27.p_)->second).
              super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              ((iVar27.p_)->second).
              super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00335b35;
          iVar27 = boost::unordered::detail::foa::
                   table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::vector<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>_>_>_>
                   ::begin(&ppVar5[uVar12 * 0xf + uVar18].second.table_);
          sVar26 = TimingPathSymbol::getOutputs
                             (*((iVar27.p_)->second).
                               super__Vector_base<const_slang::ast::TimingPathSymbol_*,_std::allocator<const_slang::ast::TimingPathSymbol_*>_>
                               ._M_impl.super__Vector_impl_data._M_start);
          lVar13 = 0;
          goto LAB_00335a9d;
        }
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar15 & 7] & bVar9) == 0) break;
      lVar13 = uVar12 + uVar16;
      uVar16 = uVar16 + 1;
      uVar12 = lVar13 + 1U & uVar6;
    } while (uVar16 <= uVar6);
  }
  goto LAB_00335b35;
  while( true ) {
    this_02 = *(Expression **)((long)sVar26._M_ptr + lVar13);
    pSVar14 = Expression::getSymbolReference(this_02,true);
    lVar13 = lVar13 + 8;
    if (pSVar14 == pSVar11) break;
LAB_00335a9d:
    if (sVar26._M_extent._M_extent_value._M_extent_value << 3 == lVar13) {
      SVar19 = (SourceLocation)0x0;
      SVar20 = (SourceLocation)0x0;
      goto LAB_00335aca;
    }
  }
  SVar19 = (this_02->sourceRange).startLoc;
  SVar20 = (this_02->sourceRange).endLoc;
LAB_00335aca:
  this_03 = Scope::addDiag(this_00,(DiagCode)0xf20006,this_01->sourceRange);
  arg = parsing::Token::valueText((Token *)&pSVar4[3].parent);
  Diagnostic::operator<<(this_03,arg);
  Diagnostic::operator<<(this_03,pSVar11->name);
  range.endLoc = SVar20;
  range.startLoc = SVar19;
  Diagnostic::addNote(this_03,(DiagCode)0x50001,range);
LAB_00335b35:
  ppEVar10 = ppEVar10 + 1;
  goto LAB_0033597b;
}

Assistant:

void PulseStyleSymbol::checkPreviouslyUsed(const TimingPathMap& timingPathMap) const {
    auto parent = getParentScope();
    auto syntax = getSyntax();
    SLANG_ASSERT(parent && syntax);

    for (auto terminal : getTerminals()) {
        if (auto symbol = terminal->getSymbolReference()) {
            if (auto it = timingPathMap.find(symbol); it != timingPathMap.end()) {
                if (!it->second.empty() && !it->second.begin()->second.empty()) {
                    SourceRange pathRange;
                    auto first = it->second.begin()->second.front();
                    for (auto outputExpr : first->getOutputs()) {
                        if (outputExpr->getSymbolReference() == symbol) {
                            pathRange = outputExpr->sourceRange;
                            break;
                        }
                    }

                    SLANG_ASSERT(pathRange != SourceRange());

                    auto& diag = parent->addDiag(diag::InvalidPulseStyle, terminal->sourceRange);
                    diag << syntax->as<PulseStyleDeclarationSyntax>().keyword.valueText();
                    diag << symbol->name;
                    diag.addNote(diag::NoteDeclarationHere, pathRange);
                }
            }
        }
    }
}